

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::deleteProgram
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTFragmentShader *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_vs_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTFragmentShader::deleteProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete shader objects */
	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}
}